

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalCreateMutex
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpMutexAttributes,BOOL bInitialOwner,
                    LPCWSTR lpName,HANDLE *phMutex)

{
  uint uVar1;
  size_t sVar2;
  char *__format;
  LPSECURITY_ATTRIBUTES p_Var3;
  LPCWSTR pWStack_60;
  CObjectAttributes oa;
  IPalObject *pobjRegisteredMutex;
  ISynchStateController *pssc;
  IPalObject *pobjMutex;
  
  pWStack_60 = (LPCWSTR)0x0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  oa.sObjectName._8_8_ = lpMutexAttributes;
  if (lpName != (LPCWSTR)0x0) {
    sVar2 = PAL_wcslen(lpName);
    oa.sObjectName.m_pwsz = (WCHAR *)CONCAT44((int)sVar2 + 1,(int)sVar2);
    pWStack_60 = lpName;
  }
  pssc = (ISynchStateController *)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  pobjRegisteredMutex = (IPalObject *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0xcb);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (phMutex == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0xcc);
    fprintf(_stderr,"Expression: NULL != phMutex\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_003404ce;
  if (lpName == (LPCWSTR)0x0) {
    uVar1 = (**(code **)*g_pObjectManager)(g_pObjectManager,pthr,&otMutex,&pWStack_60,&pssc);
    p_Var3 = (LPSECURITY_ATTRIBUTES)pssc;
    if (uVar1 == 0) {
      uVar1 = (*pssc->_vptr_ISynchStateController[5])(pssc,pthr,&pobjRegisteredMutex);
      if (uVar1 == 0) {
        if (bInitialOwner == 0) {
          uVar1 = (*pobjRegisteredMutex->_vptr_IPalObject[1])(pobjRegisteredMutex,1);
        }
        else {
          uVar1 = (*pobjRegisteredMutex->_vptr_IPalObject[4])(pobjRegisteredMutex,pthr);
        }
        (*pobjRegisteredMutex->_vptr_IPalObject[6])();
        if (uVar1 == 0) {
          uVar1 = (**(code **)(*g_pObjectManager + 8))
                            (g_pObjectManager,pthr,pssc,&aotMutex,0,phMutex,&oa.pSecurityAttributes)
          ;
          pssc = (ISynchStateController *)0x0;
          p_Var3 = oa.pSecurityAttributes;
          goto LAB_00340472;
        }
        fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
                ,0x102);
        __format = "Unable to set initial mutex state (%d)\n";
      }
      else {
        fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
                ,0xf1);
        __format = "Unable to create state controller (%d)\n";
      }
      fprintf(_stderr,__format,(ulong)uVar1);
      p_Var3 = (LPSECURITY_ATTRIBUTES)pssc;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0xd9);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    uVar1 = 0x32;
    p_Var3 = (LPSECURITY_ATTRIBUTES)pssc;
  }
LAB_00340472:
  if (p_Var3 != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)p_Var3 + 0x40))(p_Var3,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return uVar1;
  }
LAB_003404ce:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateMutex(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpMutexAttributes,
    BOOL bInitialOwner,
    LPCWSTR lpName,
    HANDLE *phMutex
    )
{
    CObjectAttributes oa(lpName, lpMutexAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjMutex = NULL;
    IPalObject *pobjRegisteredMutex = NULL;
    ISynchStateController *pssc = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phMutex);

    ENTRY("InternalCreateMutex(pthr=%p, lpMutexAttributes=%p, bInitialOwner=%d"
        ", lpName=%p, phMutex=%p)\n",
        pthr,
        lpMutexAttributes,
        bInitialOwner,
        lpName,
        phMutex
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateMutexExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        &otMutex,
        &oa,
        &pobjMutex
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateMutexExit;
    }

    palError = pobjMutex->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to create state controller (%d)\n", palError);
        goto InternalCreateMutexExit;
    }

    if (bInitialOwner)
    {
        palError = pssc->SetOwner(pthr);
    }
    else
    {
        palError = pssc->SetSignalCount(1);
    }

    pssc->ReleaseController();

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to set initial mutex state (%d)\n", palError);
        goto InternalCreateMutexExit;
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjMutex,
        &aotMutex,
        0, // should be MUTEX_ALL_ACCESS -- currently ignored (no Win32 security)
        phMutex,
        &pobjRegisteredMutex
        );

    //
    // pobjMutex is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pobjMutex = NULL;

InternalCreateMutexExit:

    if (NULL != pobjMutex)
    {
        pobjMutex->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredMutex)
    {
        pobjRegisteredMutex->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateMutex returns %i\n", palError);

    return palError;
}